

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_argv.cpp
# Opt level: O3

FString __thiscall DArgs::TakeValue(DArgs *this,char *check)

{
  uint uVar1;
  int iVar2;
  char *in_RDX;
  FString *other;
  uint index;
  ulong uVar3;
  
  uVar1 = *(uint *)(check + 0x34);
  if (1 < (ulong)uVar1) {
    other = (FString *)(*(long *)(check + 0x28) + 0x10);
    uVar3 = 1;
    do {
      iVar2 = strcasecmp(in_RDX,other[-1].Chars);
      if (iVar2 == 0) {
        (this->super_DObject)._vptr_DObject = (_func_int **)0x8a502c;
        FString::NullString.RefCount = FString::NullString.RefCount + 1;
        index = (uint)uVar3;
        if ((int)uVar1 <= (int)index || (int)index < 1) {
          return (FString)(char *)this;
        }
        if (((index < uVar1 - 1) && (*other->Chars != '+')) && (*other->Chars != '-')) {
          FString::operator=((FString *)this,other);
          TArray<FString,_FString>::Delete((TArray<FString,_FString> *)(check + 0x28),index,2);
          return (FString)(char *)this;
        }
        TArray<FString,_FString>::Delete((TArray<FString,_FString> *)(check + 0x28),index);
        return (FString)(char *)this;
      }
      uVar3 = uVar3 + 1;
      other = other + 1;
    } while (uVar1 != uVar3);
  }
  (this->super_DObject)._vptr_DObject = (_func_int **)0x8a502c;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  return (FString)(char *)this;
}

Assistant:

FString DArgs::TakeValue(const char *check)
{
	int i = CheckParm(check);
	FString out;

	if (i > 0 && i < (int)Argv.Size())
	{
		if (i < (int)Argv.Size() - 1 && Argv[i+1][0] != '+' && Argv[i+1][0] != '-')
		{
			out = Argv[i+1];
			Argv.Delete(i, 2);	// Delete the parm and its value.
		}
		else
		{
			Argv.Delete(i);		// Just delete the parm, since it has no value.
		}
	}
	return out;
}